

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::compiles6v(json_service *this,array *f)

{
  double *pdVar1;
  ostream *poVar2;
  runtime_error *this_00;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *in_RSI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[](in_RSI,0);
  pdVar1 = (double *)cppcms::json::value::number();
  if ((*pdVar1 == 1.0) && (!NAN(*pdVar1))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x66);
  std::operator<<(poVar2," f[0].number()==1");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles6v(cppcms::json::array f) { TEST(f[0].number()==1); }